

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall cmFindPackageCommand::HandlePackageMode(cmFindPackageCommand *this)

{
  cmMakefile *pcVar1;
  bool bVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  char *pcVar8;
  ulong uVar9;
  ostream *poVar10;
  reference pvVar11;
  size_type sVar12;
  reference pvVar13;
  char *local_8a8;
  ulong local_648;
  size_type i_1;
  char *sep;
  string consideredVersions;
  string consideredConfigFiles;
  string consideredVersionsVar;
  string consideredConfigsVar;
  string fileVar;
  string local_578 [32];
  string local_558;
  allocator local_531;
  string local_530;
  allocator local_509;
  string local_508;
  allocator local_4e1;
  string local_4e0;
  string local_4c0;
  string local_4a0 [8];
  string requestedVersionString;
  size_type i;
  ostringstream aw;
  undefined1 local_300 [8];
  ostringstream e;
  string local_180 [5];
  bool configFileSetFOUNDFalse;
  bool found;
  bool result;
  string notFoundMessage;
  string notFoundMessageVar;
  string foundVar;
  string local_118;
  undefined1 local_f8 [8];
  string file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  allocator local_91;
  undefined1 local_90 [8];
  string dir;
  char *pcStack_68;
  bool fileFound;
  char *def;
  undefined1 local_50 [8];
  string upperFound;
  string upperDir;
  cmFindPackageCommand *this_local;
  
  std::
  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  ::clear(&this->ConsideredConfigs);
  cmsys::SystemTools::UpperCase((string *)((long)&upperFound.field_2 + 8),&this->Name);
  cmsys::SystemTools::UpperCase((string *)local_50,&this->Name);
  std::__cxx11::string::operator+=((string *)(upperFound.field_2._M_local_buf + 8),"_DIR");
  std::__cxx11::string::operator+=((string *)local_50,"_FOUND");
  pcStack_68 = cmMakefile::GetDefinition
                         ((this->super_cmFindCommon).super_cmCommand.Makefile,&this->Variable);
  dir.field_2._M_local_buf[0xf] = '\0';
  if ((this->UseConfigFiles & 1U) != 0) {
    bVar4 = cmSystemTools::IsOff(pcStack_68);
    if (!bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_90,pcStack_68,&local_91);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_90);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      bVar4 = cmsys::SystemTools::FileIsFullPath(pcVar8);
      if (!bVar4) {
        std::operator+(&local_b8,"/",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                      );
        std::__cxx11::string::operator=((string *)local_90,(string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        pcVar8 = cmMakefile::GetCurrentSourceDirectory
                           ((this->super_cmFindCommon).super_cmCommand.Makefile);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&file.field_2 + 8),pcVar8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                      );
        std::__cxx11::string::operator=
                  ((string *)local_90,(string *)(file.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::string((string *)local_f8);
      bVar4 = FindConfigFile(this,(string *)local_90,(string *)local_f8);
      if (bVar4) {
        std::__cxx11::string::operator=((string *)&this->FileFound,(string *)local_f8);
        dir.field_2._M_local_buf[0xf] = '\x01';
      }
      pcStack_68 = cmMakefile::GetDefinition
                             ((this->super_cmFindCommon).super_cmCommand.Makefile,&this->Variable);
      std::__cxx11::string::~string((string *)local_f8);
      std::__cxx11::string::~string((string *)local_90);
    }
    bVar4 = cmSystemTools::IsOff(pcStack_68);
    if ((bVar4) || ((dir.field_2._M_local_buf[0xf] & 1U) == 0)) {
      dir.field_2._M_local_buf[0xf] = FindConfig(this);
    }
    if (((dir.field_2._M_local_buf[0xf] & 1U) != 0) &&
       (uVar9 = std::__cxx11::string::empty(), (uVar9 & 1) != 0)) {
      pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_118,"fileFound is true but FileFound is empty!",
                 (allocator *)(foundVar.field_2._M_local_buf + 0xf));
      cmMakefile::IssueMessage(pcVar1,INTERNAL_ERROR,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator((allocator<char> *)(foundVar.field_2._M_local_buf + 0xf));
      dir.field_2._M_local_buf[0xf] = '\0';
    }
  }
  std::__cxx11::string::string
            ((string *)(notFoundMessageVar.field_2._M_local_buf + 8),(string *)&this->Name);
  std::__cxx11::string::operator+=((string *)(notFoundMessageVar.field_2._M_local_buf + 8),"_FOUND")
  ;
  std::__cxx11::string::string
            ((string *)(notFoundMessage.field_2._M_local_buf + 8),(string *)&this->Name);
  std::__cxx11::string::operator+=
            ((string *)(notFoundMessage.field_2._M_local_buf + 8),"_NOT_FOUND_MESSAGE");
  std::__cxx11::string::string(local_180);
  bVar4 = true;
  bVar2 = false;
  bVar6 = false;
  if ((dir.field_2._M_local_buf[0xf] & 1U) != 0) {
    bVar5 = cmMakefile::IsDefinitionSet
                      ((this->super_cmFindCommon).super_cmCommand.Makefile,
                       (string *)((long)&notFoundMessageVar.field_2 + 8));
    if ((bVar5) &&
       (bVar5 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,
                                 (string *)((long)&notFoundMessageVar.field_2 + 8)), !bVar5)) {
      cmMakefile::RemoveDefinition
                ((this->super_cmFindCommon).super_cmCommand.Makefile,
                 (string *)((long)&notFoundMessageVar.field_2 + 8));
    }
    cmMakefile::RemoveDefinition
              ((this->super_cmFindCommon).super_cmCommand.Makefile,
               (string *)((long)&notFoundMessage.field_2 + 8));
    StoreVersionFound(this);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    bVar5 = ReadListFile(this,pcVar8,DoPolicyScope);
    if (bVar5) {
      bVar2 = true;
      bVar5 = cmMakefile::IsDefinitionSet
                        ((this->super_cmFindCommon).super_cmCommand.Makefile,
                         (string *)((long)&notFoundMessageVar.field_2 + 8));
      if ((bVar5) &&
         (bVar5 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,
                                   (string *)((long)&notFoundMessageVar.field_2 + 8)), !bVar5)) {
        bVar2 = false;
        bVar6 = true;
        pcVar8 = cmMakefile::GetSafeDefinition
                           ((this->super_cmFindCommon).super_cmCommand.Makefile,
                            (string *)((long)&notFoundMessage.field_2 + 8));
        std::__cxx11::string::operator=(local_180,pcVar8);
      }
    }
    else {
      bVar4 = false;
    }
  }
  if (((bVar4 != false) && (!bVar2)) && (((this->Quiet & 1U) == 0 || ((this->Required & 1U) != 0))))
  {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_300);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&i);
    if (bVar6) {
      poVar10 = std::operator<<((ostream *)local_300,"Found package configuration file:\n  ");
      poVar10 = std::operator<<(poVar10,(string *)&this->FileFound);
      poVar10 = std::operator<<(poVar10,"\nbut it set ");
      poVar10 = std::operator<<(poVar10,(string *)(notFoundMessageVar.field_2._M_local_buf + 8));
      poVar10 = std::operator<<(poVar10," to FALSE so package \"");
      poVar10 = std::operator<<(poVar10,(string *)&this->Name);
      std::operator<<(poVar10,"\" is considered to be NOT FOUND.");
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        poVar10 = std::operator<<((ostream *)local_300," Reason given by package: \n");
        poVar10 = std::operator<<(poVar10,local_180);
        std::operator<<(poVar10,"\n");
      }
    }
    else {
      bVar6 = std::
              vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
              ::empty(&this->ConsideredConfigs);
      if (bVar6) {
        std::__cxx11::string::string(local_4a0);
        uVar9 = std::__cxx11::string::empty();
        if ((uVar9 & 1) == 0) {
          std::__cxx11::string::operator=(local_4a0," (requested version ");
          std::__cxx11::string::operator+=(local_4a0,(string *)&this->Version);
          std::__cxx11::string::operator+=(local_4a0,")");
        }
        if ((this->UseConfigFiles & 1U) == 0) {
          poVar10 = std::operator<<((ostream *)local_300,"No \"Find");
          poVar10 = std::operator<<(poVar10,(string *)&this->Name);
          poVar10 = std::operator<<(poVar10,".cmake\" found in ");
          std::operator<<(poVar10,"CMAKE_MODULE_PATH.");
          poVar10 = std::operator<<((ostream *)&i,"Find");
          poVar10 = std::operator<<(poVar10,(string *)&this->Name);
          poVar10 = std::operator<<(poVar10,
                                    ".cmake must either be part of this project itself, in this case adjust CMAKE_MODULE_PATH so that it points to the correct location inside its source tree.\nOr it must be installed by a package which has already been found via find_package().  In this case make sure that package has indeed been found and adjust CMAKE_MODULE_PATH to contain the location where that package has installed Find"
                                   );
          poVar10 = std::operator<<(poVar10,(string *)&this->Name);
          std::operator<<(poVar10,
                          ".cmake.  This must be a location provided by that package.  This error in general means that the buildsystem of this project is relying on a Find-module without ensuring that it is actually available.\n"
                         );
        }
        else {
          if ((this->UseFindModules & 1U) != 0) {
            poVar10 = std::operator<<((ostream *)local_300,"By not providing \"Find");
            poVar10 = std::operator<<(poVar10,(string *)&this->Name);
            poVar10 = std::operator<<(poVar10,
                                      ".cmake\" in CMAKE_MODULE_PATH this project has asked CMake to find a package configuration file provided by \""
                                     );
            poVar10 = std::operator<<(poVar10,(string *)&this->Name);
            std::operator<<(poVar10,"\", but CMake did not find one.\n");
          }
          sVar12 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&this->Configs);
          if (sVar12 == 1) {
            poVar10 = std::operator<<((ostream *)local_300,
                                      "Could not find a package configuration file named \"");
            pvVar11 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](&this->Configs,0);
            poVar10 = std::operator<<(poVar10,(string *)pvVar11);
            poVar10 = std::operator<<(poVar10,"\" provided by package \"");
            poVar10 = std::operator<<(poVar10,(string *)&this->Name);
            poVar10 = std::operator<<(poVar10,"\"");
            poVar10 = std::operator<<(poVar10,local_4a0);
            std::operator<<(poVar10,".\n");
          }
          else {
            poVar10 = std::operator<<((ostream *)local_300,
                                      "Could not find a package configuration file provided by \"");
            poVar10 = std::operator<<(poVar10,(string *)&this->Name);
            poVar10 = std::operator<<(poVar10,"\"");
            poVar10 = std::operator<<(poVar10,local_4a0);
            poVar10 = std::operator<<(poVar10," with any of the following names:\n");
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_4e0,"  ",&local_4e1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_508,"",&local_509);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_530,"\n",&local_531);
            cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      (&local_4c0,&local_4e0,&this->Configs,&local_508,&local_530);
            poVar10 = std::operator<<(poVar10,(string *)&local_4c0);
            std::operator<<(poVar10,"\n");
            std::__cxx11::string::~string((string *)&local_4c0);
            std::__cxx11::string::~string((string *)&local_530);
            std::allocator<char>::~allocator((allocator<char> *)&local_531);
            std::__cxx11::string::~string((string *)&local_508);
            std::allocator<char>::~allocator((allocator<char> *)&local_509);
            std::__cxx11::string::~string((string *)&local_4e0);
            std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
          }
          poVar10 = std::operator<<((ostream *)local_300,"Add the installation prefix of \"");
          poVar10 = std::operator<<(poVar10,(string *)&this->Name);
          poVar10 = std::operator<<(poVar10,"\" to CMAKE_PREFIX_PATH or set \"");
          poVar10 = std::operator<<(poVar10,(string *)&this->Variable);
          poVar10 = std::operator<<(poVar10,
                                    "\" to a directory containing one of the above files. If \"");
          poVar10 = std::operator<<(poVar10,(string *)&this->Name);
          std::operator<<(poVar10,
                          "\" provides a separate development package or SDK, be sure it has been installed."
                         );
        }
        std::__cxx11::string::~string(local_4a0);
      }
      else {
        poVar10 = std::operator<<((ostream *)local_300,
                                  "Could not find a configuration file for package \"");
        poVar10 = std::operator<<(poVar10,(string *)&this->Name);
        poVar10 = std::operator<<(poVar10,"\" that ");
        pcVar8 = "is compatible with";
        if ((this->VersionExact & 1U) != 0) {
          pcVar8 = "exactly matches";
        }
        poVar10 = std::operator<<(poVar10,pcVar8);
        poVar10 = std::operator<<(poVar10," requested version \"");
        poVar10 = std::operator<<(poVar10,(string *)&this->Version);
        poVar10 = std::operator<<(poVar10,"\".\n");
        std::operator<<(poVar10,
                        "The following configuration files were considered but not accepted:\n");
        for (requestedVersionString.field_2._8_8_ = 0; uVar3 = requestedVersionString.field_2._8_8_,
            sVar12 = std::
                     vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                     ::size(&this->ConsideredConfigs), (ulong)uVar3 < sVar12;
            requestedVersionString.field_2._8_8_ = requestedVersionString.field_2._8_8_ + 1) {
          poVar10 = std::operator<<((ostream *)local_300,"  ");
          pvVar13 = std::
                    vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                    ::operator[](&this->ConsideredConfigs,requestedVersionString.field_2._8_8_);
          poVar10 = std::operator<<(poVar10,(string *)pvVar13);
          poVar10 = std::operator<<(poVar10,", version: ");
          pvVar13 = std::
                    vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                    ::operator[](&this->ConsideredConfigs,requestedVersionString.field_2._8_8_);
          poVar10 = std::operator<<(poVar10,(string *)&pvVar13->version);
          std::operator<<(poVar10,"\n");
        }
      }
    }
    pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
    bVar6 = this->Required;
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(pcVar1,((byte)~bVar6 & 1) * 3 + FATAL_ERROR,&local_558);
    std::__cxx11::string::~string((string *)&local_558);
    if ((this->Required & 1U) != 0) {
      cmSystemTools::SetFatalErrorOccured();
    }
    std::__cxx11::ostringstream::str();
    bVar7 = std::__cxx11::string::empty();
    std::__cxx11::string::~string(local_578);
    if (((bVar7 ^ 0xff) & 1) != 0) {
      pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)((long)&fileVar.field_2 + 8));
      std::__cxx11::string::~string((string *)(fileVar.field_2._M_local_buf + 8));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&i);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_300);
  }
  if (bVar2) {
    local_8a8 = "1";
  }
  else {
    local_8a8 = "0";
  }
  cmMakefile::AddDefinition
            ((this->super_cmFindCommon).super_cmCommand.Makefile,
             (string *)((long)&notFoundMessageVar.field_2 + 8),local_8a8);
  std::__cxx11::string::string
            ((string *)(consideredConfigsVar.field_2._M_local_buf + 8),(string *)&this->Name);
  std::__cxx11::string::operator+=
            ((string *)(consideredConfigsVar.field_2._M_local_buf + 8),"_CONFIG");
  if (bVar2) {
    pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
    pcVar8 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(pcVar1,(string *)((long)&consideredConfigsVar.field_2 + 8),pcVar8);
  }
  else {
    cmMakefile::RemoveDefinition
              ((this->super_cmFindCommon).super_cmCommand.Makefile,
               (string *)((long)&consideredConfigsVar.field_2 + 8));
  }
  std::__cxx11::string::string
            ((string *)(consideredVersionsVar.field_2._M_local_buf + 8),(string *)&this->Name);
  std::__cxx11::string::operator+=
            ((string *)(consideredVersionsVar.field_2._M_local_buf + 8),"_CONSIDERED_CONFIGS");
  std::__cxx11::string::string
            ((string *)(consideredConfigFiles.field_2._M_local_buf + 8),(string *)&this->Name);
  std::__cxx11::string::operator+=
            ((string *)(consideredConfigFiles.field_2._M_local_buf + 8),"_CONSIDERED_VERSIONS");
  std::__cxx11::string::string((string *)(consideredVersions.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&sep);
  i_1 = (long)"user=%s\x01auth=Bearer %s\x01\x01" + 0x18;
  for (local_648 = 0;
      sVar12 = std::
               vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
               ::size(&this->ConsideredConfigs), local_648 < sVar12; local_648 = local_648 + 1) {
    std::__cxx11::string::operator+=
              ((string *)(consideredVersions.field_2._M_local_buf + 8),(char *)i_1);
    std::__cxx11::string::operator+=((string *)&sep,(char *)i_1);
    pvVar13 = std::
              vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
              ::operator[](&this->ConsideredConfigs,local_648);
    std::__cxx11::string::operator+=
              ((string *)(consideredVersions.field_2._M_local_buf + 8),(string *)pvVar13);
    pvVar13 = std::
              vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
              ::operator[](&this->ConsideredConfigs,local_648);
    std::__cxx11::string::operator+=((string *)&sep,(string *)&pvVar13->version);
    i_1 = (long)"\"$;" + 2;
  }
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  pcVar8 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(pcVar1,(string *)((long)&consideredVersionsVar.field_2 + 8),pcVar8);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  pcVar8 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(pcVar1,(string *)((long)&consideredConfigFiles.field_2 + 8),pcVar8);
  std::__cxx11::string::~string((string *)&sep);
  std::__cxx11::string::~string((string *)(consideredVersions.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(consideredConfigFiles.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(consideredVersionsVar.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(consideredConfigsVar.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string((string *)(notFoundMessage.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(notFoundMessageVar.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(upperFound.field_2._M_local_buf + 8));
  return bVar4;
}

Assistant:

bool cmFindPackageCommand::HandlePackageMode()
{
  this->ConsideredConfigs.clear();

  // Support old capitalization behavior.
  std::string upperDir = cmSystemTools::UpperCase(this->Name);
  std::string upperFound = cmSystemTools::UpperCase(this->Name);
  upperDir += "_DIR";
  upperFound += "_FOUND";

  // Try to find the config file.
  const char* def = this->Makefile->GetDefinition(this->Variable);

  // Try to load the config file if the directory is known
  bool fileFound = false;
  if (this->UseConfigFiles)
    {
    if(!cmSystemTools::IsOff(def))
      {
      // Get the directory from the variable value.
      std::string dir = def;
      cmSystemTools::ConvertToUnixSlashes(dir);

      // Treat relative paths with respect to the current source dir.
      if(!cmSystemTools::FileIsFullPath(dir.c_str()))
        {
        dir = "/" + dir;
        dir = this->Makefile->GetCurrentSourceDirectory() + dir;
        }
      // The file location was cached.  Look for the correct file.
      std::string file;
      if (this->FindConfigFile(dir, file))
        {
        this->FileFound = file;
        fileFound = true;
        }
      def = this->Makefile->GetDefinition(this->Variable);
      }

    // Search for the config file if it is not already found.
    if(cmSystemTools::IsOff(def) || !fileFound)
      {
      fileFound = this->FindConfig();
      }

    // Sanity check.
    if(fileFound && this->FileFound.empty())
      {
      this->Makefile->IssueMessage(
        cmake::INTERNAL_ERROR, "fileFound is true but FileFound is empty!");
      fileFound = false;
      }
    }

  std::string foundVar = this->Name;
  foundVar += "_FOUND";
  std::string notFoundMessageVar = this->Name;
  notFoundMessageVar += "_NOT_FOUND_MESSAGE";
  std::string notFoundMessage;

  // If the directory for the config file was found, try to read the file.
  bool result = true;
  bool found = false;
  bool configFileSetFOUNDFalse = false;

  if(fileFound)
    {
    if ((this->Makefile->IsDefinitionSet(foundVar))
      && (this->Makefile->IsOn(foundVar) == false))
      {
      // by removing Foo_FOUND here if it is FALSE, we don't really change
      // the situation for the Config file which is about to be included,
      // but we make it possible to detect later on whether the Config file
      // has set Foo_FOUND to FALSE itself:
      this->Makefile->RemoveDefinition(foundVar);
      }
    this->Makefile->RemoveDefinition(notFoundMessageVar);

    // Set the version variables before loading the config file.
    // It may override them.
    this->StoreVersionFound();

    // Parse the configuration file.
    if(this->ReadListFile(this->FileFound.c_str(), DoPolicyScope))
      {
      // The package has been found.
      found = true;

      // Check whether the Config file has set Foo_FOUND to FALSE:
      if ((this->Makefile->IsDefinitionSet(foundVar))
           && (this->Makefile->IsOn(foundVar) == false))
        {
        // we get here if the Config file has set Foo_FOUND actively to FALSE
        found = false;
        configFileSetFOUNDFalse = true;
        notFoundMessage = this->Makefile->GetSafeDefinition(
                                                   notFoundMessageVar);
        }
      }
    else
      {
      // The configuration file is invalid.
      result = false;
      }
    }

  if (result && !found && (!this->Quiet || this->Required))
    {
    // The variable is not set.
    std::ostringstream e;
    std::ostringstream aw;
    if (configFileSetFOUNDFalse)
      {
      e << "Found package configuration file:\n"
        "  " << this->FileFound << "\n"
        "but it set " << foundVar << " to FALSE so package \"" <<
        this->Name << "\" is considered to be NOT FOUND.";
      if (!notFoundMessage.empty())
        {
        e << " Reason given by package: \n" << notFoundMessage << "\n";
        }
      }
    // If there are files in ConsideredConfigs, it means that FooConfig.cmake
    // have been found, but they didn't have appropriate versions.
    else if (!this->ConsideredConfigs.empty())
      {
      e << "Could not find a configuration file for package \""
        << this->Name << "\" that "
        << (this->VersionExact? "exactly matches" : "is compatible with")
        << " requested version \"" << this->Version << "\".\n"
        << "The following configuration files were considered but not "
           "accepted:\n";
      for(std::vector<ConfigFileInfo>::size_type i=0;
          i<this->ConsideredConfigs.size(); i++)
        {
        e << "  " << this->ConsideredConfigs[i].filename
          << ", version: " << this->ConsideredConfigs[i].version << "\n";
        }
      }
    else
      {
      std::string requestedVersionString;
      if(!this->Version.empty())
        {
        requestedVersionString = " (requested version ";
        requestedVersionString += this->Version;
        requestedVersionString += ")";
        }

      if (this->UseConfigFiles)
        {
        if(this->UseFindModules)
          {
          e << "By not providing \"Find" << this->Name << ".cmake\" in "
               "CMAKE_MODULE_PATH this project has asked CMake to find a "
               "package configuration file provided by \""<<this->Name<< "\", "
               "but CMake did not find one.\n";
          }

        if(this->Configs.size() == 1)
          {
          e << "Could not find a package configuration file named \""
            << this->Configs[0] << "\" provided by package \""
            << this->Name << "\"" << requestedVersionString <<".\n";
          }
        else
          {
          e << "Could not find a package configuration file provided by \""
            << this->Name << "\"" << requestedVersionString
            << " with any of the following names:\n"
            << cmWrap("  ", this->Configs, "", "\n") << "\n";
          }

        e << "Add the installation prefix of \"" << this->Name << "\" to "
          "CMAKE_PREFIX_PATH or set \"" << this->Variable << "\" to a "
          "directory containing one of the above files. "
          "If \"" << this->Name << "\" provides a separate development "
          "package or SDK, be sure it has been installed.";
        }
      else // if(!this->UseFindModules && !this->UseConfigFiles)
        {
        e << "No \"Find" << this->Name << ".cmake\" found in "
          << "CMAKE_MODULE_PATH.";

        aw<< "Find"<< this->Name <<".cmake must either be part of this "
             "project itself, in this case adjust CMAKE_MODULE_PATH so that "
             "it points to the correct location inside its source tree.\n"
             "Or it must be installed by a package which has already been "
             "found via find_package().  In this case make sure that "
             "package has indeed been found and adjust CMAKE_MODULE_PATH to "
             "contain the location where that package has installed "
             "Find" << this->Name << ".cmake.  This must be a location "
             "provided by that package.  This error in general means that "
             "the buildsystem of this project is relying on a Find-module "
             "without ensuring that it is actually available.\n";
        }
      }


    this->Makefile->IssueMessage(
      this->Required? cmake::FATAL_ERROR : cmake::WARNING, e.str());
    if (this->Required)
      {
      cmSystemTools::SetFatalErrorOccured();
      }

    if (!aw.str().empty())
      {
      this->Makefile->IssueMessage(cmake::AUTHOR_WARNING,aw.str());
      }
    }

  // Set a variable marking whether the package was found.
  this->Makefile->AddDefinition(foundVar, found? "1":"0");

  // Set a variable naming the configuration file that was found.
  std::string fileVar = this->Name;
  fileVar += "_CONFIG";
  if(found)
    {
    this->Makefile->AddDefinition(fileVar, this->FileFound.c_str());
    }
  else
    {
    this->Makefile->RemoveDefinition(fileVar);
    }

  std::string consideredConfigsVar = this->Name;
  consideredConfigsVar += "_CONSIDERED_CONFIGS";
  std::string consideredVersionsVar = this->Name;
  consideredVersionsVar += "_CONSIDERED_VERSIONS";

  std::string consideredConfigFiles;
  std::string consideredVersions;

  const char* sep = "";
  for(std::vector<ConfigFileInfo>::size_type i=0;
      i<this->ConsideredConfigs.size(); i++)
    {
    consideredConfigFiles += sep;
    consideredVersions += sep;
    consideredConfigFiles += this->ConsideredConfigs[i].filename;
    consideredVersions += this->ConsideredConfigs[i].version;
    sep = ";";
    }

  this->Makefile->AddDefinition(consideredConfigsVar,
                                consideredConfigFiles.c_str());

  this->Makefile->AddDefinition(consideredVersionsVar,
                                consideredVersions.c_str());

  return result;
}